

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.h
# Opt level: O1

void __thiscall FIX::Session::reset(Session *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  string local_38;
  
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
  generateLogout(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  disconnect(this);
  if ((this->m_timestamper).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->m_timestamper)._M_invoker)((UtcTimeStamp *)&local_38,(_Any_data *)&this->m_timestamper)
    ;
    SessionState::reset(&this->m_state,(UtcTimeStamp *)&local_38);
    return;
  }
  uVar2 = std::__throw_bad_function_call();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar2);
}

Assistant:

void reset() EXCEPT(IOException) {
    generateLogout();
    disconnect();
    m_state.reset(m_timestamper());
  }